

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<unsigned_long> __thiscall wasm::WATParser::Lexer::takeOffset(Lexer *this)

{
  bool bVar1;
  ulong uVar2;
  _Storage<unsigned_long,_true> unaff_R15;
  string_view in;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  optional<unsigned_long> oVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined1 local_b8 [8];
  Lexer subLexer;
  undefined1 local_38 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  
  in = next(this);
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._8_1_ == '\x01') {
    uVar2 = 0;
    unaff_R15._M_value = 7;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,0,7);
    __y._M_str = "offset=";
    __y._M_len = 7;
    bVar1 = std::operator!=(bVar3,__y);
    if (bVar1) goto LAB_00c01896;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,7,
                       0xffffffffffffffff);
    Lexer((Lexer *)local_b8,bVar3,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&subLexer.buffer._M_str);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&subLexer.buffer._M_str);
    oVar4 = takeU<unsigned_long>((Lexer *)local_b8);
    unaff_R15._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    uVar2 = (ulong)oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_4_;
    if (((undefined1  [16])
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      this->pos = this->pos + (long)local_38;
      advance(this);
      ~Lexer((Lexer *)local_b8);
      goto LAB_00c01896;
    }
    ~Lexer((Lexer *)local_b8);
  }
  uVar2 = 0;
LAB_00c01896:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Lexer::takeOffset() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 7) != "offset="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(7));
    if (auto o = subLexer.takeU64()) {
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}